

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_resume_data.cpp
# Opt level: O0

add_torrent_params *
libtorrent::read_resume_data(add_torrent_params *__return_storage_ptr__,span<const_char> buffer)

{
  error_code ec_00;
  error_code ec_01;
  bool bVar1;
  system_error *psVar2;
  span<const_char> buffer_00;
  int in_stack_ffffffffffffff20;
  libtorrent *local_80;
  char *local_78;
  undefined1 local_70 [8];
  bdecode_node rd;
  error_code ec;
  span<const_char> buffer_local;
  add_torrent_params *ret;
  
  ec.cat_ = (error_category *)buffer.m_ptr;
  boost::system::error_code::error_code((error_code *)&rd.m_size);
  span<char_const>::span<libtorrent::span<char_const>,char_const,void>
            ((span<char_const> *)&local_80,(span<const_char> *)&ec.cat_);
  buffer_00.m_len = (difference_type)&rd.m_size;
  buffer_00.m_ptr = local_78;
  bdecode((bdecode_node *)local_70,local_80,buffer_00,(error_code *)0x0,(int *)0x64,2000000,
          in_stack_ffffffffffffff20);
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)&rd.m_size);
  if (bVar1) {
    psVar2 = (system_error *)__cxa_allocate_exception(0x40);
    ec_01.cat_ = (error_category *)ec._0_8_;
    ec_01.val_ = rd.m_size;
    ec_01.failed_ = (bool)rd._60_1_;
    ec_01._5_3_ = rd._61_3_;
    boost::system::system_error::system_error(psVar2,ec_01);
    __cxa_throw(psVar2,&boost::system::system_error::typeinfo,
                boost::system::system_error::~system_error);
  }
  read_resume_data(__return_storage_ptr__,(bdecode_node *)local_70,(error_code *)&rd.m_size);
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)&rd.m_size);
  if (bVar1) {
    psVar2 = (system_error *)__cxa_allocate_exception(0x40);
    ec_00.cat_ = (error_category *)ec._0_8_;
    ec_00.val_ = rd.m_size;
    ec_00.failed_ = (bool)rd._60_1_;
    ec_00._5_3_ = rd._61_3_;
    boost::system::system_error::system_error(psVar2,ec_00);
    __cxa_throw(psVar2,&boost::system::system_error::typeinfo,
                boost::system::system_error::~system_error);
  }
  bdecode_node::~bdecode_node((bdecode_node *)local_70);
  return __return_storage_ptr__;
}

Assistant:

add_torrent_params read_resume_data(span<char const> buffer)
	{
		error_code ec;
		bdecode_node rd = bdecode(buffer, ec);
		if (ec) throw system_error(ec);

		auto ret = read_resume_data(rd, ec);
		if (ec) throw system_error(ec);
		return ret;
	}